

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GPUShaderFP64Test7::getGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  _variable_type type;
  pointer p_Var2;
  string *psVar3;
  ostream *poVar4;
  ulong uVar5;
  _variable_type type_00;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  string variable_type_string;
  stringstream array_index_sstream;
  stringstream result_sstream;
  string local_3d8;
  uint local_3b4;
  long *local_3b0;
  long local_3a8;
  long local_3a0 [2];
  long *local_390;
  long local_388;
  long local_380 [2];
  string *local_370;
  pointer local_368;
  pointer local_360;
  long local_358;
  ulong local_350;
  _variables *local_348;
  undefined1 local_340 [128];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar7 = 
  "#version 400\n\nlayout(triangles)                      in;\nlayout(triangle_strip, max_vertices=4) out;\n\nin TE_DATA\n{\n"
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "#version 400\n\nlayout(triangles)                      in;\nlayout(triangle_strip, max_vertices=4) out;\n\nin TE_DATA\n{\n"
             ,0x73);
  getVariableDeclarations_abi_cxx11_
            ((string *)local_340,(GPUShaderFP64Test7 *)pcVar7,"te",variables,
             glcts::fixed_sample_locations_values + 1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_340._0_8_,local_340._8_8_);
  pcVar7 = "} in_data[];\n\nout GS_DATA\n{\n";
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} in_data[];\n\nout GS_DATA\n{\n",0x1c)
  ;
  getVariableDeclarations_abi_cxx11_(&local_3d8,(GPUShaderFP64Test7 *)pcVar7,"gs",variables,"flat");
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_3d8._M_dataplus._M_p,local_3d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"};\n\nvoid main()\n{\n",0x12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  local_370 = __return_storage_ptr__;
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  local_360 = (variables->
              super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_368 = (variables->
              super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_350 = ((long)local_368 - (long)local_360 >> 2) * -0x5555555555555555;
  lVar9 = 0;
  local_348 = variables;
  do {
    local_358 = lVar9;
    if (local_368 != local_360) {
      uVar5 = 0;
      do {
        p_Var2 = (local_348->
                 super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar1 = p_Var2[uVar5].array_size;
        type = p_Var2[uVar5].type;
        local_3b4 = Utils::getNumberOfComponentsForVariableType(type);
        Utils::getVariableTypeString_abi_cxx11_(&local_3d8,(Utils *)(ulong)type,type_00);
        if ((ulong)uVar1 != 0) {
          uVar6 = 0;
          do {
            std::__cxx11::stringstream::stringstream((stringstream *)local_340);
            if (uVar1 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_340 + 0x10),"[",1);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)(local_340 + 0x10));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"gs_variable",0xb);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__cxx11::stringbuf::str();
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,(char *)local_390,local_388);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4," = in_data[0].te_variable",0x19);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__cxx11::stringbuf::str();
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,(char *)local_3b0,local_3a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," + ",3);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,local_3d8._M_dataplus._M_p,local_3d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
            if (local_3b0 != local_3a0) {
              operator_delete(local_3b0,local_3a0[0] + 1);
            }
            uVar10 = local_3b4;
            if (local_390 != local_380) {
              operator_delete(local_390,local_380[0] + 1);
              uVar10 = local_3b4;
            }
            do {
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              if (uVar10 != 1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              }
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
            std::ios_base::~ios_base(local_2c0);
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (uVar5 < local_350);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_Position = vec4(",0x13);
    lVar9 = local_358;
    lVar8 = local_358 * 0x10;
    poVar4 = std::ostream::_M_insert<double>((double)*(float *)(&DAT_01a3b510 + lVar8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    poVar4 = std::ostream::_M_insert<double>((double)*(float *)(&DAT_01a3b514 + lVar8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    poVar4 = std::ostream::_M_insert<double>((double)*(float *)(&DAT_01a3b518 + lVar8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    poVar4 = std::ostream::_M_insert<double>((double)*(float *)(&DAT_01a3b51c + lVar8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\nEmitVertex();\n",0x11);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"EndPrimitive();\n}\n",0x12);
  psVar3 = local_370;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar3;
}

Assistant:

std::string GPUShaderFP64Test7::getGeometryShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "layout(triangles)                      in;\n"
					  "layout(triangle_strip, max_vertices=4) out;\n"
					  "\n"

					  /* Add the input block */
					  "in TE_DATA\n"
					  "{\n"
				   << getVariableDeclarations("te", variables) << "} in_data[];\n"
																  "\n"

																  /* Add the output block */
																  "out GS_DATA\n"
																  "{\n"
				   << getVariableDeclarations("gs", variables, "flat") << "};\n"
																		  "\n"

																		  /* Declare main() function */
																		  "void main()\n"
																		  "{\n";

	/* Take input variables, add a predefined value and forward them to output variables */
	const float quad_vertices[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
									1.0f,  -1.0f, 0.0f, 1.0f, 1.0f,  1.0f, 0.0f, 1.0f };
	const unsigned int n_quad_vertices =
		sizeof(quad_vertices) / sizeof(quad_vertices[0]) / 4 /* components per vertex */;
	const size_t n_variables = variables.size();

	for (unsigned int n_quad_vertex = 0; n_quad_vertex < n_quad_vertices; ++n_quad_vertex)
	{
		unsigned int counter			 = 4;
		const float* current_quad_vertex = quad_vertices + n_quad_vertex * 4 /* components per vertex */;

		for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
		{
			unsigned int		  variable_array_size = variables[n_variable].array_size;
			Utils::_variable_type variable_type		  = variables[n_variable].type;
			unsigned int n_variable_type_components   = Utils::getNumberOfComponentsForVariableType(variable_type);
			std::string  variable_type_string		  = Utils::getVariableTypeString(variable_type);

			for (unsigned int index = 0; index < variable_array_size; ++index)
			{
				std::stringstream array_index_sstream;

				if (variable_array_size > 1)
				{
					array_index_sstream << "[" << index << "]";
				}

				result_sstream << "gs_variable" << n_variable << array_index_sstream.str()
							   << " = in_data[0].te_variable" << n_variable << array_index_sstream.str() << " + "
							   << variable_type_string << "(";

				for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
				{
					result_sstream << (counter++);

					if (n_component != (n_variable_type_components - 1))
					{
						result_sstream << ", ";
					}
				} /* for (all components) */

				result_sstream << ");\n";
			} /* for (all array indices) */
		}	 /* for (all variable types) */

		result_sstream << "gl_Position = vec4(" << current_quad_vertex[0] << ", " << current_quad_vertex[1] << ", "
					   << current_quad_vertex[2] << ", " << current_quad_vertex[3] << ");\n"
																					  "EmitVertex();\n";
	} /* for (all emitted quad vertices) */

	result_sstream << "EndPrimitive();\n"
					  "}\n";

	/* All done */
	return result_sstream.str();
}